

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O1

void avro::codec_traits<umu::_union_map_union_Union__1__>::decode
               (Decoder *d,_union_map_union_Union__1__ *v)

{
  placeholder *ppVar1;
  ulong uVar2;
  undefined8 *puVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  vv;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  local_50;
  
  uVar2 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_50._M_impl._0_8_ = &local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)&local_50);
    *puVar3 = 0x1c87a0;
    puVar3[1] = 0x1c87d0;
    __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar2 & 1) == 0) {
    local_50._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50._M_impl.super__Rb_tree_header._M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>_>
    ::decode(d,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                *)&local_50);
    v->idx_ = 0;
    boost::any::operator=
              (&v->value_,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                *)&local_50);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
    ::~_Rb_tree(&local_50);
  }
  else {
    (**(code **)(*(long *)d + 0x18))(d);
    v->idx_ = 1;
    ppVar1 = (v->value_).content;
    (v->value_).content = (placeholder *)0x0;
    if (ppVar1 != (placeholder *)0x0) {
      (*ppVar1->_vptr_placeholder[1])();
      return;
    }
  }
  return;
}

Assistant:

static void decode(Decoder& d, umu::_union_map_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::map<std::string, umu::r3 > vv;
                avro::decode(d, vv);
                v.set_map(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }